

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts3EvalDlPhraseNext(Fts3Table *pTab,Fts3Doclist *pDL,u8 *pbEof)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  sqlite3_int64 iDelta;
  undefined1 *local_40;
  char *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar2 = pDL->aAll;
  pcVar4 = pDL->pNextDocid;
  if (((pDL->pNextDocid == (char *)0x0) && (pcVar4 = pcVar2, pcVar2 == (char *)0x0)) ||
     (iVar1 = pDL->nAll, pcVar2 + iVar1 <= pcVar4)) {
    *pbEof = '\x01';
  }
  else {
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    iVar3 = sqlite3Fts3GetVarintU(pcVar4,(sqlite_uint64 *)&local_40);
    local_38 = pcVar4 + iVar3;
    if ((pTab->bDescIdx == '\0') || (pDL->pNextDocid == (char *)0x0)) {
      pDL->iDocid = (sqlite3_int64)(local_40 + pDL->iDocid);
    }
    else {
      pDL->iDocid = pDL->iDocid - (long)local_40;
    }
    pDL->pList = local_38;
    fts3PoslistCopy((char **)0x0,&local_38);
    pDL->nList = (int)local_38 - *(int *)&pDL->pList;
    for (pcVar4 = local_38; (pcVar4 < pcVar2 + iVar1 && (*pcVar4 == '\0')); pcVar4 = pcVar4 + 1) {
    }
    pDL->pNextDocid = pcVar4;
    *pbEof = '\0';
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void fts3EvalDlPhraseNext(
  Fts3Table *pTab,
  Fts3Doclist *pDL,
  u8 *pbEof
){
  char *pIter;                            /* Used to iterate through aAll */
  char *pEnd;                             /* 1 byte past end of aAll */

  if( pDL->pNextDocid ){
    pIter = pDL->pNextDocid;
    assert( pDL->aAll!=0 || pIter==0 );
  }else{
    pIter = pDL->aAll;
  }

  if( pIter==0 || pIter>=(pEnd = pDL->aAll + pDL->nAll) ){
    /* We have already reached the end of this doclist. EOF. */
    *pbEof = 1;
  }else{
    sqlite3_int64 iDelta;
    pIter += sqlite3Fts3GetVarint(pIter, &iDelta);
    if( pTab->bDescIdx==0 || pDL->pNextDocid==0 ){
      pDL->iDocid += iDelta;
    }else{
      pDL->iDocid -= iDelta;
    }
    pDL->pList = pIter;
    fts3PoslistCopy(0, &pIter);
    pDL->nList = (int)(pIter - pDL->pList);

    /* pIter now points just past the 0x00 that terminates the position-
    ** list for document pDL->iDocid. However, if this position-list was
    ** edited in place by fts3EvalNearTrim(), then pIter may not actually
    ** point to the start of the next docid value. The following line deals
    ** with this case by advancing pIter past the zero-padding added by
    ** fts3EvalNearTrim().  */
    while( pIter<pEnd && *pIter==0 ) pIter++;

    pDL->pNextDocid = pIter;
    assert( pIter>=&pDL->aAll[pDL->nAll] || *pIter );
    *pbEof = 0;
  }
}